

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  int iVar1;
  byte *pbVar2;
  char *pcVar3;
  char *pcVar4;
  byte *in_RSI;
  Parse *in_RDI;
  int cnt;
  int mxSelect;
  Select *pLoop;
  Select *pNext;
  int local_28;
  byte *local_20;
  byte *local_18;
  
  if (*(long *)(in_RSI + 0x50) != 0) {
    local_18 = (byte *)0x0;
    local_28 = 1;
    pbVar2 = in_RSI;
    do {
      local_20 = pbVar2;
      *(byte **)(local_20 + 0x58) = local_18;
      *(uint *)(local_20 + 4) = *(uint *)(local_20 + 4) | 0x100;
      local_18 = local_20;
      pbVar2 = *(byte **)(local_20 + 0x50);
      if (pbVar2 == (byte *)0x0) goto LAB_001b5410;
      local_28 = local_28 + 1;
    } while ((*(long *)(pbVar2 + 0x48) == 0) && (*(long *)(pbVar2 + 0x60) == 0));
    pcVar3 = "LIMIT";
    if (*(long *)(pbVar2 + 0x48) != 0) {
      pcVar3 = "ORDER BY";
    }
    pcVar4 = sqlite3SelectOpName((uint)*local_20);
    sqlite3ErrorMsg(in_RDI,"%s clause should come after %s not before",pcVar3,pcVar4);
LAB_001b5410:
    if ((((*(uint *)(in_RSI + 4) & 0x600) == 0) && (iVar1 = in_RDI->db->aLimit[4], 0 < iVar1)) &&
       (iVar1 < local_28)) {
      sqlite3ErrorMsg(in_RDI,"too many terms in compound SELECT");
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    assert( p!=0 );
    if( p->pPrior ){
      Select *pNext = 0, *pLoop = p;
      int mxSelect, cnt = 1;
      while(1){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
        pNext = pLoop;
        pLoop = pLoop->pPrior;
        if( pLoop==0 ) break;
        cnt++;
        if( pLoop->pOrderBy || pLoop->pLimit ){
          sqlite3ErrorMsg(pParse,"%s clause should come after %s not before",
             pLoop->pOrderBy!=0 ? "ORDER BY" : "LIMIT",
             sqlite3SelectOpName(pNext->op));
          break;
        }
      }
      if( (p->selFlags & (SF_MultiValue|SF_Values))==0
       && (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0
       && cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }